

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-balance-sampling.hpp
# Opt level: O2

void diy::detail::move_sample_blocks
               (Master *master,Master *aux_master,
               vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
               *sample_work_info,WorkInfo *my_work_info,float quantile)

{
  float quantile_local;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  WorkInfo *local_98;
  float *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  code *local_58;
  code *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  code *local_38;
  code *local_30;
  
  local_90 = &quantile_local;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b0 = Catch::clara::std::
             _Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_invoke;
  local_b8 = Catch::clara::std::
             _Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_manager;
  quantile_local = quantile;
  local_a8._M_unused._M_object = master;
  local_a8._8_8_ = sample_work_info;
  local_98 = my_work_info;
  Master::
  foreach<diy::detail::move_sample_blocks(diy::Master&,diy::Master&,std::vector<diy::detail::WorkInfo,std::allocator<diy::detail::WorkInfo>>const&,diy::detail::WorkInfo_const&,float)::_lambda(diy::detail::AuxBlock*,diy::Master::ProxyWithLink_const&)_1_>
            (aux_master,(anon_class_32_4_f9d1e44c *)&local_a8,(Skip *)&local_c8);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = Catch::clara::std::
             _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
             ::_M_invoke;
  local_78 = Catch::clara::std::
             _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
             ::_M_manager;
  local_68 = 0;
  uStack_60 = 0;
  local_50 = Catch::clara::std::
             _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
             ::_M_invoke;
  local_58 = Catch::clara::std::
             _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
             ::_M_manager;
  local_48 = 0;
  uStack_40 = 0;
  local_30 = Catch::clara::std::
             _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
             ::_M_invoke;
  local_38 = Catch::clara::std::
             _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
             ::_M_manager;
  Master::exchange(aux_master,true,(MemoryManagement *)&local_88);
  MemoryManagement::~MemoryManagement((MemoryManagement *)&local_88);
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_90 = (float *)Catch::clara::std::
                      _Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                      _M_invoke;
  local_98 = (WorkInfo *)
             Catch::clara::std::
             _Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_manager;
  local_c8._M_unused._M_object = master;
  Master::
  foreach<diy::detail::move_sample_blocks(diy::Master&,diy::Master&,std::vector<diy::detail::WorkInfo,std::allocator<diy::detail::WorkInfo>>const&,diy::detail::WorkInfo_const&,float)::_lambda(diy::detail::AuxBlock*,diy::Master::ProxyWithLink_const&)_2_>
            (aux_master,(anon_class_8_1_60b11ba0 *)&local_c8,(Skip *)&local_a8);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  return;
}

Assistant:

inline void move_sample_blocks(diy::Master&                    master,                 // real master with multiple blocks per process
                        diy::Master&                    aux_master,             // auxiliary master with 1 block per process for communcating between procs
                        const std::vector<WorkInfo>&    sample_work_info,       // sampled work info
                        const WorkInfo&                 my_work_info,           // my work info
                        float                           quantile)               // quantile cutoff above which to move blocks (0.0 - 1.0)
{
    // rexchange moving blocks
    aux_master.foreach([&](AuxBlock* b, const diy::Master::ProxyWithLink& cp)
            { send_block(b, cp, master, sample_work_info, my_work_info, quantile); });
    aux_master.exchange(true);      // true = remote
    aux_master.foreach([&](AuxBlock* b, const diy::Master::ProxyWithLink& cp)
            { recv_block(b, cp, master); });
}